

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::ScopedMessage::ScopedMessage(ScopedMessage *this,MessageBuilder *builder)

{
  IResultCapture *pIVar1;
  MessageInfo *in_RDI;
  MessageInfo *in_stack_ffffffffffffffc0;
  string local_30 [48];
  
  MessageInfo::MessageInfo(in_stack_ffffffffffffffc0,in_RDI);
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::operator=((string *)&in_RDI->message,local_30);
  std::__cxx11::string::~string(local_30);
  pIVar1 = getResultCapture();
  (*pIVar1->_vptr_IResultCapture[6])(pIVar1,in_RDI);
  return;
}

Assistant:

ScopedMessage::ScopedMessage( MessageBuilder const& builder )
    : m_info( builder.m_info )
    {
        m_info.message = builder.m_stream.str();
        getResultCapture().pushScopedMessage( m_info );
    }